

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::ES5ArrayTypeHandlerBase<int>::UpdateAttribute
          (ES5ArrayTypeHandlerBase<int> *this,DynamicObject *instance,PropertyId propertyId,
          PropertyAttributes attr,BOOL value,BOOL *isNumericPropertyId)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  BOOL BVar4;
  IndexPropertyDescriptorMap *pIVar5;
  ES5Array *arr;
  PrototypeChainCache<Js::OnlyWritablePropertyCache> *pPVar6;
  undefined1 local_80 [39];
  byte local_59;
  undefined1 local_58 [7];
  PropertyAttributes newAttr;
  Type local_50;
  IndexPropertyDescriptor *descriptor;
  Type TStack_40;
  uint32 index;
  ScriptContext *scriptContext;
  BOOL *isNumericPropertyId_local;
  byte local_25;
  BOOL value_local;
  PropertyAttributes attr_local;
  Type TStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  ES5ArrayTypeHandlerBase<int> *this_local;
  
  scriptContext = (ScriptContext *)isNumericPropertyId;
  isNumericPropertyId_local._4_4_ = value;
  local_25 = attr;
  value_local = propertyId;
  TStack_20.ptr = (RuntimeFunction *)instance;
  instance_local = (DynamicObject *)this;
  TStack_40.ptr =
       (RuntimeFunction *)RecyclableObject::GetScriptContext(&instance->super_RecyclableObject);
  BVar4 = ScriptContext::IsNumericPropertyId
                    ((ScriptContext *)TStack_40.ptr,value_local,(uint32 *)((long)&descriptor + 4));
  *(BOOL *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo = BVar4;
  if (*(int *)&(scriptContext->super_ScriptContextInfo)._vptr_ScriptContextInfo == 0) {
    this_local._4_4_ = 0;
  }
  else {
    pIVar5 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                       (&this->indexPropertyMap);
    bVar1 = IndexPropertyDescriptorMap::TryGetReference
                      (pIVar5,descriptor._4_4_,(IndexPropertyDescriptor **)&local_50);
    if (bVar1) {
      if (((ulong)((local_50.ptr)->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
          & 8) != 0) {
        return 0;
      }
      if (isNumericPropertyId_local._4_4_ == 0) {
        *(byte *)&((local_50.ptr)->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
             = *(byte *)&((local_50.ptr)->super_RootObjectBase).super_DynamicObject.
                         super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject
                         ._vptr_IRecyclerVisitedObject & (local_25 ^ 0xff);
        if (((ulong)((local_50.ptr)->super_RootObjectBase).super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject & 4) == 0) {
          DynamicTypeHandler::ClearHasOnlyWritableDataProperties((DynamicTypeHandler *)this);
          bVar3 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
          if ((bVar3 & 0x20) != 0) {
            RecyclableObject::GetLibrary((RecyclableObject *)TStack_20.ptr);
            JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
                      ((JavascriptLibrary *)local_58);
            pPVar6 = Memory::
                     WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
                     operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                                 *)local_58);
            PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(pPVar6);
          }
        }
      }
      else {
        *(byte *)&((local_50.ptr)->super_RootObjectBase).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
             = *(byte *)&((local_50.ptr)->super_RootObjectBase).super_DynamicObject.
                         super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject
                         ._vptr_IRecyclerVisitedObject | local_25;
      }
    }
    else {
      arr = VarTo<Js::ES5Array,Js::DynamicObject>((DynamicObject *)TStack_20.ptr);
      BVar4 = HasDataItem(this,arr,descriptor._4_4_);
      if (BVar4 == 0) {
        return 0;
      }
      local_59 = GetDataItemAttributes(this);
      if (isNumericPropertyId_local._4_4_ == 0) {
        local_59 = local_59 & (local_25 ^ 0xff);
      }
      else {
        local_59 = local_59 | local_25;
      }
      bVar3 = local_59;
      bVar2 = GetDataItemAttributes(this);
      if (bVar3 != bVar2) {
        pIVar5 = Memory::WriteBarrierPtr<Js::IndexPropertyDescriptorMap>::operator->
                           (&this->indexPropertyMap);
        IndexPropertyDescriptor::IndexPropertyDescriptor
                  ((IndexPropertyDescriptor *)(local_80 + 8),local_59,(Var)0x0,(Var)0x0);
        IndexPropertyDescriptorMap::Add
                  (pIVar5,descriptor._4_4_,(IndexPropertyDescriptor *)(local_80 + 8));
        if ((local_59 & 4) == 0) {
          DynamicTypeHandler::ClearHasOnlyWritableDataProperties((DynamicTypeHandler *)this);
          bVar3 = DynamicTypeHandler::GetFlags((DynamicTypeHandler *)this);
          if ((bVar3 & 0x20) != 0) {
            RecyclableObject::GetLibrary((RecyclableObject *)TStack_20.ptr);
            JavascriptLibrary::GetTypesWithOnlyWritablePropertyProtoChainCache
                      ((JavascriptLibrary *)local_80);
            pPVar6 = Memory::
                     WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>::
                     operator->((WriteBarrierPtr<Js::PrototypeChainCache<Js::OnlyWritablePropertyCache>_>
                                 *)local_80);
            PrototypeChainCache<Js::OnlyWritablePropertyCache>::Clear(pPVar6);
          }
        }
      }
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

BOOL ES5ArrayTypeHandlerBase<T>::UpdateAttribute(DynamicObject* instance, PropertyId propertyId, PropertyAttributes attr, BOOL value, BOOL& isNumericPropertyId)
    {
        ScriptContext* scriptContext = instance->GetScriptContext();

        uint32 index;
        isNumericPropertyId = scriptContext->IsNumericPropertyId(propertyId, &index);
        if (isNumericPropertyId)
        {
            IndexPropertyDescriptor* descriptor;
            if (indexPropertyMap->TryGetReference(index, &descriptor))
            {
                if (descriptor->Attributes & PropertyDeleted)
                {
                    return false;
                }

                if (value)
                {
                    descriptor->Attributes |= attr;
                }
                else
                {
                    descriptor->Attributes &= (~attr);
                    if (!(descriptor->Attributes & PropertyWritable))
                    {
                        this->ClearHasOnlyWritableDataProperties();
                        if(this->GetFlags() & this->IsPrototypeFlag)
                        {
                            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
                        }
                    }
                }
            }
            else
            {
                if (!HasDataItem(VarTo<ES5Array>(instance), index))
                {
                    return false;
                }

                PropertyAttributes newAttr = GetDataItemAttributes();
                if (value)
                {
                    newAttr |= attr;
                }
                else
                {
                    newAttr &= (~attr);
                }

                if (newAttr != GetDataItemAttributes())
                {
                    indexPropertyMap->Add(index, IndexPropertyDescriptor(newAttr));
                    if (!(newAttr & PropertyWritable))
                    {
                        this->ClearHasOnlyWritableDataProperties();
                        if(this->GetFlags() & this->IsPrototypeFlag)
                        {
                            instance->GetLibrary()->GetTypesWithOnlyWritablePropertyProtoChainCache()->Clear();
                        }
                    }
                }
            }

            return true;
        }

        return false;
    }